

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O3

xmlTextWriterPtr xmlNewTextWriterTree(xmlDocPtr doc,xmlNodePtr node,int compression)

{
  xmlParserCtxtPtr ctxt;
  xmlTextWriterPtr pxVar1;
  char *pcVar2;
  int compression_00;
  xmlSAXHandler saxHandler;
  xmlSAXHandler local_128;
  
  if (doc == (xmlDocPtr)0x0) {
    pcVar2 = "xmlNewTextWriterTree : invalid document tree!\n";
  }
  else {
    memset(&local_128,0,0x100);
    xmlSAX2InitDefaultSAXHandler(&local_128,1);
    local_128.startDocument = xmlTextWriterStartDocumentCallback;
    compression_00 = 0;
    ctxt = xmlCreatePushParserCtxt(&local_128,(void *)0x0,(char *)0x0,0,(char *)0x0);
    if (ctxt == (xmlParserCtxtPtr)0x0) {
      pcVar2 = "xmlNewTextWriterDoc : error at xmlCreatePushParserCtxt!\n";
    }
    else {
      ctxt->dictNames = 0;
      pxVar1 = xmlNewTextWriterPushParser(ctxt,compression_00);
      if (pxVar1 != (xmlTextWriterPtr)0x0) {
        ctxt->myDoc = doc;
        ctxt->node = node;
        pxVar1->no_doc_free = 1;
        xmlSetDocCompressMode(doc,compression);
        return pxVar1;
      }
      xmlFreeParserCtxt(ctxt);
      pcVar2 = "xmlNewTextWriterDoc : error at xmlNewTextWriterPushParser!\n";
    }
  }
  xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0,
                (xmlNode *)0x0,0x19,1,XML_ERR_FATAL,(char *)0x0,0,(char *)0x0,(char *)0x0,
                (char *)0x0,0,0,"%s",pcVar2);
  return (xmlTextWriterPtr)0x0;
}

Assistant:

xmlTextWriterPtr
xmlNewTextWriterTree(xmlDocPtr doc, xmlNodePtr node, int compression)
{
    xmlTextWriterPtr ret;
    xmlSAXHandler saxHandler;
    xmlParserCtxtPtr ctxt;

    if (doc == NULL) {
        xmlWriterErrMsg(NULL, XML_ERR_INTERNAL_ERROR,
                        "xmlNewTextWriterTree : invalid document tree!\n");
        return NULL;
    }

    memset(&saxHandler, '\0', sizeof(saxHandler));
    xmlSAX2InitDefaultSAXHandler(&saxHandler, 1);
    saxHandler.startDocument = xmlTextWriterStartDocumentCallback;

    ctxt = xmlCreatePushParserCtxt(&saxHandler, NULL, NULL, 0, NULL);
    if (ctxt == NULL) {
        xmlWriterErrMsg(NULL, XML_ERR_INTERNAL_ERROR,
                        "xmlNewTextWriterDoc : error at xmlCreatePushParserCtxt!\n");
        return NULL;
    }
    /*
     * For some reason this seems to completely break if node names
     * are interned.
     */
    ctxt->dictNames = 0;

    ret = xmlNewTextWriterPushParser(ctxt, compression);
    if (ret == NULL) {
        xmlFreeParserCtxt(ctxt);
        xmlWriterErrMsg(NULL, XML_ERR_INTERNAL_ERROR,
                        "xmlNewTextWriterDoc : error at xmlNewTextWriterPushParser!\n");
        return NULL;
    }

    ctxt->myDoc = doc;
    ctxt->node = node;
    ret->no_doc_free = 1;

    xmlSetDocCompressMode(doc, compression);

    return ret;
}